

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TransformFeedbackBufferStorageTestCase::TransformFeedbackBufferStorageTestCase
          (TransformFeedbackBufferStorageTestCase *this,Functions *gl,TestContext *testContext,
          GLint page_size,bool all_pages_committed)

{
  (this->super_BufferStorageTestCase)._vptr_BufferStorageTestCase =
       (_func_int **)&PTR__BufferStorageTestCase_01dd3b70;
  this->m_all_pages_committed = all_pages_committed;
  this->m_data_bo = 0;
  this->m_data_bo_index_data_offset = 0;
  this->m_data_bo_indexed_indirect_arg_offset = 0;
  this->m_data_bo_indexed_mdi_arg_offset = 0;
  this->m_data_bo_indexed_mdi_arg_offset = 0;
  this->m_data_bo_regular_indirect_arg_offset = 0;
  this->m_data_bo_regular_mdi_arg_offset = 0;
  this->m_data_bo_size = 0;
  this->m_draw_call_baseInstance = 0x4cf;
  this->m_draw_call_baseVertex = 0x10001;
  this->m_draw_call_first = 0x391;
  this->m_draw_call_firstIndex = 4;
  this->m_gl = gl;
  this->m_helper_bo = 0;
  this->m_index_data = (GLuint *)0x0;
  this->m_index_data_size = 0;
  this->m_indirect_arg_data = (GLuint *)0x0;
  this->m_indirect_arg_data_size = 0;
  this->m_min_memory_page_span = 4;
  this->m_multidrawcall_drawcount = 0xffffffff;
  this->m_multidrawcall_primcount = 0xffffffff;
  this->m_n_instances_to_test = 4;
  this->m_n_vertices_per_instance = 0;
  this->m_page_size = page_size;
  this->m_po_ia = 0;
  this->m_po_sa = 0;
  this->m_result_bo = 0;
  this->m_result_bo_size = 0;
  this->m_result_bo_size_rounded = 0;
  this->m_testCtx = testContext;
  this->m_vao = 0;
  return;
}

Assistant:

TransformFeedbackBufferStorageTestCase::TransformFeedbackBufferStorageTestCase(const glw::Functions& gl,
																			   tcu::TestContext&	 testContext,
																			   glw::GLint			 page_size,
																			   bool all_pages_committed)
	: m_all_pages_committed(all_pages_committed)
	, m_data_bo(0)
	, m_data_bo_index_data_offset(0)
	, m_data_bo_indexed_indirect_arg_offset(0)
	, m_data_bo_indexed_mdi_arg_offset(0)
	, m_data_bo_regular_indirect_arg_offset(0)
	, m_data_bo_regular_mdi_arg_offset(0)
	, m_data_bo_size(0)
	, m_draw_call_baseInstance(1231)
	, m_draw_call_baseVertex(65537)
	, m_draw_call_first(913)
	, m_draw_call_firstIndex(4)
	, m_gl(gl)
	, m_helper_bo(0)
	, m_index_data(DE_NULL)
	, m_index_data_size(0)
	, m_indirect_arg_data(DE_NULL)
	, m_indirect_arg_data_size(0)
	, m_min_memory_page_span(4) /* as per test spec */
	, m_multidrawcall_drawcount(-1)
	, m_multidrawcall_primcount(-1)
	, m_n_instances_to_test(4)
	, m_n_vertices_per_instance(0)
	, m_page_size(page_size)
	, m_po_ia(0)
	, m_po_sa(0)
	, m_result_bo(0)
	, m_result_bo_size(0)
	, m_result_bo_size_rounded(0)
	, m_testCtx(testContext)
	, m_vao(0)
{
	/* Left blank on purpose */
}